

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item::remove_child(Fl_Tree_Item *this,char *name)

{
  Fl_Tree_Item **ppFVar1;
  char *__s1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)(this->_children)._total;
  bVar5 = (long)uVar3 < 1;
  if (0 < (long)uVar3) {
    ppFVar1 = (this->_children)._items;
    uVar4 = 0;
    do {
      __s1 = ppFVar1[uVar4]->_label;
      if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,name), iVar2 == 0)) {
        Fl_Tree_Item_Array::remove(&this->_children,(char *)(uVar4 & 0xffffffff));
        break;
      }
      uVar4 = uVar4 + 1;
      bVar5 = uVar3 <= uVar4;
    } while (uVar4 != uVar3);
  }
  return -(uint)bVar5;
}

Assistant:

int Fl_Tree_Item::remove_child(const char *name) {
  for ( int t=0; t<children(); t++ ) {
    if ( child(t)->label() ) {
      if ( strcmp(child(t)->label(), name) == 0 ) {
        _children.remove(t);
	recalc_tree();		// may change tree geometry
        return(0);
      }
    }
  }
  return(-1);
}